

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_TokenWithNonCCM_Test::~InterpreterTestSuite_PC_TokenWithNonCCM_Test
          (InterpreterTestSuite_PC_TokenWithNonCCM_Test *this)

{
  InterpreterTestSuite_PC_TokenWithNonCCM_Test *this_local;
  
  ~InterpreterTestSuite_PC_TokenWithNonCCM_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_TokenWithNonCCM)
{
    TestContext ctx;
    InitContext(ctx);

    // prepare non-CCM network record
    const std::string kDomainName  = "DefaultDomain";
    const std::string kNetworkName = "net2";
    const std::string kSmPath      = "./tmp/nwk/" + kNetworkName + "/";
    uint64_t          xpanNonCcm   = 2;

    BorderAgent::State baStateNonCcm{BorderAgent::State::ConnectionMode::kPSKcConnection, 0, 0, 0, 0};

    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", baStateNonCcm, kNetworkName, xpanNonCcm,
                                       "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, kDomainName, 0, 0, "", 0,
                                       0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    // prepare fake SM for the non-CCM network
    std::vector<std::pair<std::string, std::string>> smFiles = {
        {"ca", kSmPath + "ca.pem"}, {"key", kSmPath + "priv.pem"}, {"cert", kSmPath + "cert.pem"}};

    EXPECT_EQ(RestoreFilePath(smFiles.front().second).GetCode(), ErrorCode::kNone);
    for (auto smFile : smFiles)
    {
        EXPECT_EQ(WriteFile(smFile.first, smFile.second).GetCode(), ErrorCode::kNone);
    }

    Interpreter::Expression expr;
    Interpreter::Value      value;

    CommissionerAppMockPtr pcaMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = pcaMock; }), Return(Error{})));
    // note: we do not expect RequestToken() here as 'token request'
    //       execution is prohibited with non-CCM network selected

    EXPECT_EQ(ctx.mInterpreter.mRegistry->SetCurrentNetwork(xpanNonCcm), RegistryStatus::kSuccess);
    expr  = ctx.mInterpreter.ParseExpression("token request 127.0.0.1 2001");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(!value.HasNoError());
    EXPECT_EQ(value.mError.GetCode(), ErrorCode::kInvalidState);

    EXPECT_CALL(*pcaMock, SetToken(_)).WillOnce(Return(Error{}));
    // note: we do not expect GetToken() here as no default config
    //       update to happen with a network selected

    EXPECT_EQ(WriteFile("123aef", "./tmp/token").GetCode(), ErrorCode::kNone);
    expr  = ctx.mInterpreter.ParseExpression("token set ./tmp/token");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}